

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char[2],char[42],bool,char[2],char[43],bool,char[2],char[37],bool,char[2],char[34],bool,char[2]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [2],
                   char (*args_1) [42],bool *args_2,char (*args_3) [2],char (*args_4) [43],
                   bool *args_5,char (*args_6) [2],char (*args_7) [37],bool *args_8,
                   char (*args_9) [2],char (*args_10) [34],bool *args_11,char (*args_12) [2])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_3a8;
  cmAlphaNum local_378;
  cmAlphaNum local_348;
  cmAlphaNum local_318;
  cmAlphaNum local_2e8;
  cmAlphaNum local_2b8;
  cmAlphaNum local_288;
  cmAlphaNum local_258;
  cmAlphaNum local_228;
  cmAlphaNum local_1f8;
  cmAlphaNum local_1c8;
  cmAlphaNum local_198;
  cmAlphaNum local_168;
  string_view local_138;
  string_view local_128;
  string_view local_118;
  string_view local_108;
  string_view local_f8;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  iterator local_48;
  undefined8 local_40;
  bool *local_38;
  bool *args_local_2;
  char (*args_local_1) [42];
  char (*args_local) [2];
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_38 = args_2;
  args_local_2 = (bool *)args_1;
  args_local_1 = (char (*) [42])args;
  args_local = (char (*) [2])b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_138 = cmAlphaNum::View(a);
  local_128 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_168,*args_local_1);
  local_118 = cmAlphaNum::View(&local_168);
  cmAlphaNum::cmAlphaNum(&local_198,args_local_2);
  local_108 = cmAlphaNum::View(&local_198);
  cmAlphaNum::cmAlphaNum(&local_1c8,(uint)(*local_38 & 1));
  local_f8 = cmAlphaNum::View(&local_1c8);
  cmAlphaNum::cmAlphaNum(&local_1f8,*args_3);
  local_e8 = cmAlphaNum::View(&local_1f8);
  cmAlphaNum::cmAlphaNum(&local_228,*args_4);
  local_d8 = cmAlphaNum::View(&local_228);
  cmAlphaNum::cmAlphaNum(&local_258,(uint)(*args_5 & 1));
  local_c8 = cmAlphaNum::View(&local_258);
  cmAlphaNum::cmAlphaNum(&local_288,*args_6);
  local_b8 = cmAlphaNum::View(&local_288);
  cmAlphaNum::cmAlphaNum(&local_2b8,*args_7);
  local_a8 = cmAlphaNum::View(&local_2b8);
  cmAlphaNum::cmAlphaNum(&local_2e8,(uint)(*args_8 & 1));
  local_98 = cmAlphaNum::View(&local_2e8);
  cmAlphaNum::cmAlphaNum(&local_318,*args_9);
  local_88 = cmAlphaNum::View(&local_318);
  cmAlphaNum::cmAlphaNum(&local_348,*args_10);
  local_78 = cmAlphaNum::View(&local_348);
  cmAlphaNum::cmAlphaNum(&local_378,(uint)(*args_11 & 1));
  local_68 = cmAlphaNum::View(&local_378);
  cmAlphaNum::cmAlphaNum(&local_3a8,*args_12);
  local_58 = cmAlphaNum::View(&local_3a8);
  local_48 = &local_138;
  local_40 = 0xf;
  views._M_len = 0xf;
  views._M_array = local_48;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}